

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVDB.h
# Opt level: O3

ValueType * __thiscall
nanovdb::
ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
::getValue(ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
           *this,CoordType *ijk)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ValueType *pVVar3;
  ulong uVar4;
  void *pvVar5;
  ValueType *pVVar6;
  InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u> *this_00;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  uVar2 = (this->mKey).mVec[2] ^ ijk->mVec[2] |
          (this->mKey).mVec[1] ^ ijk->mVec[1] | (this->mKey).mVec[0] ^ ijk->mVec[0];
  if (this->mNode[0] != (void *)0x0) {
    if (uVar2 < 8) {
      return (ValueType *)
             ((long)this->mNode[0] +
             (ulong)(ijk->mVec[2] & 7U | (ijk->mVec[0] & 7U) * 0x40 + (ijk->mVec[1] & 7U) * 8) * 4 +
             0x40);
    }
    this->mNode[0] = (void *)0x0;
  }
  pvVar5 = this->mNode[1];
  if (pvVar5 != (void *)0x0) {
    if (uVar2 < 0x80) {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(ulong *)ijk->mVec;
      auVar8 = vpsllvd_avx2(auVar8,_DAT_028c3d60);
      auVar7._8_8_ = 0xf000000f00;
      auVar7._0_8_ = 0xf000000f00;
      auVar7 = vpandq_avx512vl(auVar8,auVar7);
      auVar8 = vpshufd_avx(auVar7,0x55);
      auVar8 = vpor_avx(auVar8,auVar7);
      uVar4 = (ulong)((uint)ijk->mVec[2] >> 3 & 0xf | auVar8._0_4_);
      if ((*(ulong *)((long)pvVar5 + (ulong)(auVar8._0_4_ >> 6) * 8 + 0x200) >> (uVar4 & 0x3f) & 1)
          != 0) {
        pvVar5 = (void *)((long)pvVar5 +
                         (ulong)*(uint *)((long)pvVar5 + uVar4 * 4 + 0x400) * 0x860 +
                         (long)*(int *)((long)pvVar5 + 0x4420) * 0x4440);
        (this->mKey).mVec[2] = ijk->mVec[2];
        *(undefined8 *)(this->mKey).mVec = *(undefined8 *)ijk->mVec;
        this->mNode[0] = pvVar5;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = *(ulong *)ijk->mVec;
        auVar8 = vpsllvd_avx2(auVar9,_DAT_028c3d80);
        auVar1._8_8_ = 0x38000001c0;
        auVar1._0_8_ = 0x38000001c0;
        auVar7 = vpandq_avx512vl(auVar8,auVar1);
        auVar8 = vpshufd_avx(auVar7,0x55);
        auVar8 = vpor_avx(auVar8,auVar7);
        return (ValueType *)((long)pvVar5 + (ulong)(ijk->mVec[2] & 7U | auVar8._0_4_) * 4 + 0x40);
      }
      return (ValueType *)((long)pvVar5 + uVar4 * 4 + 0x400);
    }
    this->mNode[1] = (void *)0x0;
  }
  pvVar5 = this->mNode[2];
  if (pvVar5 != (void *)0x0) {
    if (uVar2 < 0x1000) {
      uVar2 = ((uint)ijk->mVec[1] >> 2 & 0x3e0) + (ijk->mVec[0] & 0xf80U) * 8;
      uVar4 = (ulong)((uint)ijk->mVec[2] >> 7 & 0x1f | uVar2);
      if ((*(ulong *)((long)pvVar5 + (ulong)(uVar2 >> 6) * 8 + 0x1000) >> (uVar4 & 0x3f) & 1) != 0)
      {
        this_00 = (InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u> *)
                  ((long)pvVar5 +
                  (ulong)*(uint *)((long)pvVar5 + uVar4 * 4 + 0x2000) * 0x4440 +
                  (long)*(int *)((long)pvVar5 + 0x22020) * 0x22040);
        (this->mKey).mVec[2] = ijk->mVec[2];
        *(undefined8 *)(this->mKey).mVec = *(undefined8 *)ijk->mVec;
        this->mNode[1] = this_00;
        pVVar6 = InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>::
                 getValueAndCache<nanovdb::ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>>>
                           (this_00,ijk,this);
        return pVVar6;
      }
      return (ValueType *)((long)pvVar5 + uVar4 * 4 + 0x2000);
    }
    this->mNode[2] = (void *)0x0;
  }
  pVVar3 = RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>
           ::
           getValueAndCache<nanovdb::ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>>>
                     ((RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>
                       *)this->mNode[3],ijk,this);
  return pVVar3;
}

Assistant:

__hostdev__ const ValueType& getValue(const CoordType& ijk) const
    {
#ifdef USE_SINGLE_ACCESSOR_KEY
        const CoordValueType dirty = this->computeDirty(ijk);
#else
        auto&& dirty = ijk;
#endif
        if (this->isCached<NodeT0>(dirty)) {
            return ((NodeT0*)mNode[0])->getValue(ijk);
        } else if (this->isCached<NodeT1>(dirty)) {
            return ((NodeT1*)mNode[1])->getValueAndCache(ijk, *this);
        } else if (this->isCached<NodeT2>(dirty)) {
            return ((NodeT2*)mNode[2])->getValueAndCache(ijk, *this);
        }
        return ((NodeT3*)mNode[3])->getValueAndCache(ijk, *this);
    }